

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O3

void __thiscall V1Transport::Reset(V1Transport *this)

{
  uint256 *puVar1;
  pointer pbVar2;
  base_blob<256U> *pbVar3;
  long in_FS_OFFSET;
  value_type local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
      .super__Vector_impl_data._M_finish != pbVar2) {
    (this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar2;
  }
  (this->vRecv).m_read_pos = 0;
  pbVar2 = (this->hdrbuf).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->hdrbuf).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    (this->hdrbuf).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar2;
  }
  (this->hdrbuf).m_read_pos = 0;
  local_19 = 0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::resize
            (&(this->hdrbuf).vch,0x18,&local_19);
  this->nHdrPos = 0;
  this->nDataPos = 0;
  puVar1 = &this->data_hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &(this->data_hash).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  pbVar3 = &(this->data_hash).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &(this->data_hash).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  this->in_data = false;
  CSHA256::Reset(&(this->hasher).sha);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Reset() EXCLUSIVE_LOCKS_REQUIRED(m_recv_mutex) {
        AssertLockHeld(m_recv_mutex);
        vRecv.clear();
        hdrbuf.clear();
        hdrbuf.resize(24);
        in_data = false;
        nHdrPos = 0;
        nDataPos = 0;
        data_hash.SetNull();
        hasher.Reset();
    }